

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::AST_Node::pretty_print_abi_cxx11_(string *__return_storage_ptr__,AST_Node *this)

{
  ostream *poVar1;
  pointer prVar2;
  _Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  local_1e0;
  string local_1c8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,(string *)&this->text);
  (**this->_vptr_AST_Node)(&local_1e0,this);
  for (prVar2 = local_1e0._M_impl.super__Vector_impl_data._M_start;
      prVar2 != local_1e0._M_impl.super__Vector_impl_data._M_finish; prVar2 = prVar2 + 1) {
    pretty_print_abi_cxx11_(&local_1c8,prVar2->_M_data);
    poVar1 = std::operator<<((ostream *)&oss,(string *)&local_1c8);
    std::operator<<(poVar1,' ');
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::
  _Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ::~_Vector_base(&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty_print() const {
      std::ostringstream oss;

      oss << text;

      for (auto &elem : get_children()) {
        oss << elem.get().pretty_print() << ' ';
      }

      return oss.str();
    }